

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanCastTests.cpp
# Opt level: O2

int testSpanCastTestsBasics(void)

{
  ostream *poVar1;
  int iVar2;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> values;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_31);
  if (((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start & 0xfffffffffffffff8U) == 0x10) {
    iVar2 = 0;
    if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == 0x10) goto LAB_00174426;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x18);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"(span.Size()) == (original.Size())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x14);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"(casted.Size()) == (size_t(2))");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  iVar2 = 1;
LAB_00174426:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar2;
}

Assistant:

int testSpanCastTestsBasics()
{
    const std::vector<int32_t> values = {1, 2, 3, 4};
    Span<const int32_t> span = MakeSpan(values);

    {  // up cast
        Span<const int64_t> casted = SpanCast<const int64_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(2));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    {  // down cast
        Span<const int8_t> casted = SpanCast<const int8_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(16));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    return 0;
}